

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O0

GLuint deqp::gls::TextureSamplerTest::createTextureCube(Functions *gl)

{
  glTexImage2DFunc p_Var1;
  GLuint GVar2;
  GLenum GVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  PixelBufferAccess *pPVar7;
  void *pvVar8;
  CubeFace local_258;
  deUint32 target;
  int face;
  Vector<float,_4> local_244;
  Vector<float,_4> local_234;
  Vector<float,_4> local_224;
  Vector<float,_4> local_214;
  Vector<float,_4> local_204;
  Vector<float,_4> local_1f4;
  Vector<float,_4> local_1e4;
  Vector<float,_4> local_1d4;
  Vector<float,_4> local_1c4;
  Vector<float,_4> local_1b4;
  Vector<float,_4> local_1a4;
  TextureFormat local_188;
  undefined1 local_180 [8];
  TextureCube refTexture;
  GLuint texture;
  Functions *gl_local;
  
  refTexture.m_view.m_levels[5]._4_4_ = 0xffffffff;
  tcu::TextureFormat::TextureFormat(&local_188,RGBA,UNORM_INT8);
  tcu::TextureCube::TextureCube((TextureCube *)local_180,&local_188,0x20);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_POSITIVE_X,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_POSITIVE_Y,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_POSITIVE_Z,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_NEGATIVE_X,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_NEGATIVE_Y,0);
  tcu::TextureCube::allocLevel((TextureCube *)local_180,CUBEFACE_NEGATIVE_Z,0);
  pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_X);
  tcu::Vector<float,_4>::Vector(&local_1a4,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_1b4,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar7,&local_1a4,&local_1b4);
  pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_Y);
  tcu::Vector<float,_4>::Vector(&local_1c4,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_1d4,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar7,&local_1c4,&local_1d4);
  pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_POSITIVE_Z);
  tcu::Vector<float,_4>::Vector(&local_1e4,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_1f4,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar7,&local_1e4,&local_1f4);
  pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_X);
  tcu::Vector<float,_4>::Vector(&local_204,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_214,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar7,&local_204,&local_214);
  pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_Y);
  tcu::Vector<float,_4>::Vector(&local_224,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector(&local_234,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar7,&local_224,&local_234);
  pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,CUBEFACE_NEGATIVE_Z);
  tcu::Vector<float,_4>::Vector(&local_244,0.0,0.0,0.0,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&target,1.0,1.0,1.0,1.0);
  tcu::fillWithComponentGradients(pPVar7,&local_244,(Vec4 *)&target);
  (*gl->bindTexture)(0x8513,refTexture.m_view.m_levels[5]._4_4_);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_CUBE_MAP, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1c3);
  for (local_258 = CUBEFACE_NEGATIVE_X; (int)local_258 < 6;
      local_258 = local_258 + CUBEFACE_POSITIVE_X) {
    dVar4 = glu::getGLCubeFace(local_258);
    p_Var1 = gl->texImage2D;
    iVar5 = tcu::TextureCube::getSize((TextureCube *)local_180);
    iVar6 = tcu::TextureCube::getSize((TextureCube *)local_180);
    pPVar7 = tcu::TextureCube::getLevelFace((TextureCube *)local_180,0,local_258);
    pvVar8 = tcu::PixelBufferAccess::getDataPtr(pPVar7);
    (*p_Var1)(dVar4,0,0x8058,iVar5,iVar6,0,0x1908,0x1401,pvVar8);
  }
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1ca);
  (*gl->generateMipmap)(0x8513);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glGenerateMipmap(GL_TEXTURE_CUBE_MAP)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1cd);
  (*gl->bindTexture)(0x8513,0);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glBindTexture(GL_TEXTURE_CUBE_MAP, texture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsSamplerObjectTest.cpp"
                  ,0x1cf);
  GVar2 = refTexture.m_view.m_levels[5]._4_4_;
  tcu::TextureCube::~TextureCube((TextureCube *)local_180);
  return GVar2;
}

Assistant:

GLuint TextureSamplerTest::createTextureCube (const glw::Functions& gl)
{
	GLuint				texture		= (GLuint)-1;
	tcu::TextureCube	refTexture	(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), CUBEMAP_SIZE);

	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_POSITIVE_Z, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_X, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Y, 0);
	refTexture.allocLevel(tcu::CUBEFACE_NEGATIVE_Z, 0);

	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_POSITIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_X), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Y), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));
	tcu::fillWithComponentGradients(refTexture.getLevelFace(0, tcu::CUBEFACE_NEGATIVE_Z), tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f));

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, texture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, texture)");

	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		const deUint32 target = glu::getGLCubeFace((tcu::CubeFace)face);
		gl.texImage2D(target, 0, GL_RGBA8, refTexture.getSize(), refTexture.getSize(), 0, GL_RGBA, GL_UNSIGNED_BYTE, refTexture.getLevelFace(0, (tcu::CubeFace)face).getDataPtr());
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage2D(GL_TEXTURE_CUBE_MAP_...) failed");

	gl.generateMipmap(GL_TEXTURE_CUBE_MAP);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenerateMipmap(GL_TEXTURE_CUBE_MAP)");
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture(GL_TEXTURE_CUBE_MAP, texture)");

	return texture;
}